

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O2

void DES_ede3_cbc_encrypt_ex
               (uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *ks1,DES_key_schedule *ks2,
               DES_key_schedule *ks3,uint8_t *ivec,int enc)

{
  byte *pbVar1;
  uint8_t uVar2;
  uint uVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t uVar7;
  uint8_t *puVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  long lVar12;
  uint local_54;
  uint local_50;
  uint local_4c;
  DES_key_schedule *local_48;
  DES_key_schedule *local_40;
  DES_key_schedule *local_38;
  
  local_54 = *(uint *)ivec;
  local_50 = *(uint *)(ivec + 4);
  local_48 = (DES_key_schedule *)ks1;
  if (enc == 0) {
    puVar8 = in + 7;
    uVar6 = local_54;
    local_4c = local_50;
    local_40 = (DES_key_schedule *)ks2;
    local_38 = (DES_key_schedule *)ks3;
    for (; 7 < len; len = len - 8) {
      uVar3 = *(uint *)(puVar8 + -7);
      uVar5 = *(uint *)(puVar8 + -3);
      local_54 = uVar3;
      local_50 = uVar5;
      DES_decrypt3(&local_54,local_48,local_40,local_38);
      uVar6 = uVar6 ^ local_54;
      local_4c = local_4c ^ local_50;
      *out = (uint8_t)uVar6;
      out[1] = (uint8_t)(uVar6 >> 8);
      out[2] = (uint8_t)(uVar6 >> 0x10);
      out[3] = (uint8_t)(uVar6 >> 0x18);
      out[4] = (uint8_t)local_4c;
      out[5] = (uint8_t)(local_4c >> 8);
      out[6] = (uint8_t)(local_4c >> 0x10);
      out[7] = (uint8_t)(local_4c >> 0x18);
      out = out + 8;
      puVar8 = puVar8 + 8;
      uVar6 = uVar3;
      local_4c = uVar5;
    }
    if (len == 0) goto LAB_0021721b;
    uVar3 = *(uint *)(puVar8 + -7);
    uVar5 = *(uint *)(puVar8 + -3);
    local_54 = uVar3;
    local_50 = uVar5;
    DES_decrypt3(&local_54,local_48,local_40,local_38);
    uVar6 = uVar6 ^ local_54;
    local_4c = local_4c ^ local_50;
    puVar8 = out + len;
    switch(len) {
    case 1:
      goto LAB_00217212;
    case 2:
      goto LAB_0021720c;
    case 3:
      goto LAB_00217201;
    case 4:
      break;
    case 7:
      puVar8[-1] = (uint8_t)(local_4c >> 0x10);
      puVar8 = puVar8 + -1;
    case 6:
      puVar8[-1] = (uint8_t)(local_4c >> 8);
      puVar8 = puVar8 + -1;
    case 5:
      puVar8[-1] = (uint8_t)local_4c;
      puVar8 = puVar8 + -1;
    }
    puVar8[-1] = (uint8_t)(uVar6 >> 0x18);
    puVar8 = puVar8 + -1;
LAB_00217201:
    puVar8[-1] = (uint8_t)(uVar6 >> 0x10);
    puVar8 = puVar8 + -1;
LAB_0021720c:
    puVar8[-1] = (uint8_t)(uVar6 >> 8);
    puVar8 = puVar8 + -1;
LAB_00217212:
    puVar8[-1] = (uint8_t)uVar6;
    local_4c = uVar5;
    uVar6 = uVar3;
LAB_0021721b:
    *ivec = (uint8_t)uVar6;
    ivec[1] = (uint8_t)(uVar6 >> 8);
    ivec[2] = (uint8_t)(uVar6 >> 0x10);
    ivec[3] = (uint8_t)(uVar6 >> 0x18);
    ivec[4] = (uint8_t)local_4c;
    ivec[5] = (uint8_t)(local_4c >> 8);
    ivec[6] = (uint8_t)(local_4c >> 0x10);
    ivec[7] = (uint8_t)(local_4c >> 0x18);
    return;
  }
  puVar8 = out + 7;
  for (; 7 < len; len = len - 8) {
    local_54 = local_54 ^ *(uint *)in;
    local_50 = local_50 ^ *(uint *)((long)in + 4);
    DES_encrypt3(&local_54,local_48,(DES_key_schedule *)ks2,(DES_key_schedule *)ks3);
    puVar8[-7] = (uint8_t)local_54;
    puVar8[-6] = (uint8_t)(local_54 >> 8);
    puVar8[-5] = (uint8_t)(local_54 >> 0x10);
    puVar8[-4] = (uint8_t)(local_54 >> 0x18);
    puVar8[-3] = (uint8_t)local_50;
    puVar8[-2] = (uint8_t)(local_50 >> 8);
    puVar8[-1] = (uint8_t)(local_50 >> 0x10);
    *puVar8 = (uint8_t)(local_50 >> 0x18);
    puVar8 = puVar8 + 8;
    in = (uint8_t *)((long)in + 8);
  }
  if (len == 0) {
    uVar2 = (uint8_t)(local_54 >> 8);
    uVar4 = (uint8_t)(local_54 >> 0x10);
    uVar7 = (uint8_t)(local_54 >> 0x18);
    uVar9 = (uint8_t)(local_50 >> 8);
    uVar10 = (uint8_t)(local_50 >> 0x10);
    uVar11 = (uint8_t)(local_50 >> 0x18);
    goto LAB_0021719e;
  }
  lVar12 = (long)in + len;
  uVar6 = 0;
  switch(len) {
  case 1:
    uVar5 = 0;
    goto LAB_0021712e;
  case 2:
    uVar5 = 0;
    goto LAB_00217121;
  case 3:
    uVar5 = 0;
    uVar3 = uVar6;
    goto LAB_00217114;
  case 4:
    goto LAB_00217107;
  case 5:
    goto LAB_002170f8;
  case 6:
    break;
  case 7:
    pbVar1 = (byte *)(lVar12 + -1);
    lVar12 = lVar12 + -1;
    uVar6 = (uint)*pbVar1 << 0x10;
  }
  pbVar1 = (byte *)(lVar12 + -1);
  lVar12 = lVar12 + -1;
  uVar6 = uVar6 | (uint)*pbVar1 << 8;
LAB_002170f8:
  pbVar1 = (byte *)(lVar12 + -1);
  lVar12 = lVar12 + -1;
  uVar6 = uVar6 | *pbVar1;
LAB_00217107:
  pbVar1 = (byte *)(lVar12 + -1);
  lVar12 = lVar12 + -1;
  uVar3 = (uint)*pbVar1 << 0x18;
  uVar5 = uVar6;
LAB_00217114:
  pbVar1 = (byte *)(lVar12 + -1);
  lVar12 = lVar12 + -1;
  uVar6 = uVar3 | (uint)*pbVar1 << 0x10;
LAB_00217121:
  pbVar1 = (byte *)(lVar12 + -1);
  lVar12 = lVar12 + -1;
  uVar6 = uVar6 | (uint)*pbVar1 << 8;
LAB_0021712e:
  local_54 = (*(byte *)(lVar12 + -1) | uVar6) ^ local_54;
  local_50 = uVar5 ^ local_50;
  DES_encrypt3(&local_54,local_48,(DES_key_schedule *)ks2,(DES_key_schedule *)ks3);
  puVar8[-7] = (uint8_t)local_54;
  uVar2 = (uint8_t)(local_54 >> 8);
  puVar8[-6] = uVar2;
  uVar4 = (uint8_t)(local_54 >> 0x10);
  puVar8[-5] = uVar4;
  uVar7 = (uint8_t)(local_54 >> 0x18);
  puVar8[-4] = uVar7;
  puVar8[-3] = (uint8_t)local_50;
  uVar9 = (uint8_t)(local_50 >> 8);
  puVar8[-2] = uVar9;
  uVar10 = (uint8_t)(local_50 >> 0x10);
  puVar8[-1] = uVar10;
  uVar11 = (uint8_t)(local_50 >> 0x18);
  *puVar8 = uVar11;
LAB_0021719e:
  *ivec = (uint8_t)local_54;
  ivec[1] = uVar2;
  ivec[2] = uVar4;
  ivec[3] = uVar7;
  ivec[4] = (uint8_t)local_50;
  ivec[5] = uVar9;
  ivec[6] = uVar10;
  ivec[7] = uVar11;
  return;
}

Assistant:

void DES_ede3_cbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                             const DES_key_schedule *ks1,
                             const DES_key_schedule *ks2,
                             const DES_key_schedule *ks3, uint8_t ivec[8],
                             int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  uint8_t *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    uint32_t t0, t1;

    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = t0;
      xor1 = t1;
    }
    if (len != 0) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = t0;
      xor1 = t1;
    }

    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }

  tin[0] = tin[1] = 0;
}